

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# piecewise_linear.cpp
# Opt level: O3

bool __thiscall
mp::
BasicPLApproximator<mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<double,_1UL>,_mp::NumericFunctionalConstraintTraits,_mp::LogAId>_>
::InitPeriodic(BasicPLApproximator<mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<double,_1UL>,_mp::NumericFunctionalConstraintTraits,_mp::LogAId>_>
               *this)

{
  pointer pdVar1;
  pointer pdVar2;
  PLApproxParams *pPVar3;
  int iVar4;
  double extraout_XMM0_Qa;
  double dVar5;
  double dVar6;
  double in_XMM1_Qa;
  pointer local_38;
  pointer pdStack_30;
  pointer local_28;
  
  iVar4 = (*this->_vptr_BasicPLApproximator[6])();
  if (SUB41(iVar4,0) != false) {
    (*this->_vptr_BasicPLApproximator[8])(&local_38,this);
    pdVar1 = (this->breakpoints_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar2 = (this->breakpoints_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
    (this->breakpoints_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start = local_38;
    (this->breakpoints_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = pdStack_30;
    (this->breakpoints_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = local_28;
    local_38 = (pointer)0x0;
    pdStack_30 = (pointer)0x0;
    local_28 = (pointer)0x0;
    if (pdVar1 != (pointer)0x0) {
      operator_delete(pdVar1,(long)pdVar2 - (long)pdVar1);
      if (local_38 != (pointer)0x0) {
        operator_delete(local_38,(long)local_28 - (long)local_38);
      }
    }
    (*this->_vptr_BasicPLApproximator[7])(this);
    pPVar3 = this->laPrm_;
    pPVar3->fUsePeriod = true;
    in_XMM1_Qa = in_XMM1_Qa - extraout_XMM0_Qa;
    pPVar3->periodLength = in_XMM1_Qa;
    dVar6 = (this->breakpoints_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish[-1];
    (pPVar3->periodRemainderRange).lb =
         *(this->breakpoints_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start;
    (pPVar3->periodRemainderRange).ub = dVar6;
    dVar6 = this->ubx_;
    dVar5 = floor((this->lbx_ - extraout_XMM0_Qa) / in_XMM1_Qa);
    dVar6 = ceil((dVar6 - extraout_XMM0_Qa) / in_XMM1_Qa);
    (pPVar3->periodicFactorRange).lb = dVar5;
    (pPVar3->periodicFactorRange).ub = dVar6;
  }
  return SUB41(iVar4,0);
}

Assistant:

bool BasicPLApproximator<FuncCon>::InitPeriodic() {
  if (IsPeriodic()) {

    breakpoints_ = GetDefaultBreakpoints();

    auto per = GetDefaultPeriod();

    laPrm_.fUsePeriod = true;
    laPrm_.periodLength = per.ub - per.lb;
    laPrm_.periodRemainderRange =
      {breakpoints_.front(), breakpoints_.back()};
    laPrm_.periodicFactorRange = {
      std::floor( (lbx()-per.lb) / laPrm_.periodLength ),
      std::ceil( (ubx()-per.lb) / laPrm_.periodLength )
    };

    return true;
  }
  return false;
}